

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O1

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  U32 *rankStats;
  undefined8 *puVar1;
  undefined8 *puVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  char cVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  size_t sVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint *puVar24;
  U32 current_1;
  ulong uVar25;
  size_t sVar26;
  size_t sVar27;
  uint uVar28;
  U32 *rankVal0;
  int iVar29;
  uint uVar30;
  U32 nbSymbols;
  U32 tableLog;
  U32 rankVal [13];
  uint local_f8;
  uint local_f4 [19];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  sVar26 = 0xffffffffffffffd4;
  sVar27 = sVar26;
  if (0x5db < wkspSize) {
    uVar6 = *DTable;
    uVar10 = uVar6 & 0xff;
    rankStats = (U32 *)((long)workSpace + 0x270);
    *(undefined8 *)((long)workSpace + 0x2cc) = 0;
    *(undefined8 *)((long)workSpace + 0x2d4) = 0;
    *(undefined8 *)((long)workSpace + 0x2c0) = 0;
    *(undefined8 *)((long)workSpace + 0x2c8) = 0;
    *(undefined8 *)((long)workSpace + 0x2b0) = 0;
    *(undefined8 *)((long)workSpace + 0x2b8) = 0;
    *(undefined8 *)((long)workSpace + 0x2a0) = 0;
    *(undefined8 *)((long)workSpace + 0x2a8) = 0;
    *(undefined8 *)((long)workSpace + 0x290) = 0;
    *(undefined8 *)((long)workSpace + 0x298) = 0;
    *(undefined8 *)((long)workSpace + 0x280) = 0;
    *(undefined8 *)((long)workSpace + 0x288) = 0;
    rankStats[0] = 0;
    rankStats[1] = 0;
    *(undefined8 *)((long)workSpace + 0x278) = 0;
    if ((uVar10 < 0xd) &&
       (sVar13 = HUF_readStats((BYTE *)((long)workSpace + 0x4dc),0x100,rankStats,&local_f8,local_f4,
                               src,srcSize), sVar27 = sVar13, sVar13 < 0xffffffffffffff89)) {
      cVar9 = (char)uVar6;
      sVar27 = sVar26;
      if (local_f4[0] <= uVar10) {
        uVar23 = 0;
        uVar11 = local_f4[0];
        do {
          uVar18 = (ulong)uVar11;
          uVar11 = uVar11 - 1;
          uVar23 = uVar23 + 1;
        } while (rankStats[uVar18] == 0);
        uVar11 = (local_f4[0] - uVar23) + 2;
        uVar30 = 0;
        if (1 < uVar11) {
          lVar17 = 0;
          uVar22 = 0;
          do {
            uVar30 = *(int *)((long)workSpace + lVar17 * 4 + 0x274) + uVar22;
            *(uint *)((long)workSpace + lVar17 * 4 + 0x2ac) = uVar22;
            lVar17 = lVar17 + 1;
            uVar22 = uVar30;
          } while ((ulong)uVar11 - 1 != lVar17);
        }
        *(uint *)((long)workSpace + 0x2a8) = uVar30;
        if ((ulong)local_f8 != 0) {
          uVar18 = 0;
          do {
            bVar3 = *(byte *)((long)workSpace + uVar18 + 0x4dc);
            uVar22 = *(uint *)((long)workSpace + (ulong)bVar3 * 4 + 0x2a8);
            *(uint *)((long)workSpace + (ulong)bVar3 * 4 + 0x2a8) = uVar22 + 1;
            *(char *)((long)workSpace + (ulong)uVar22 * 2 + 0x2dc) = (char)uVar18;
            *(byte *)((long)workSpace + (ulong)uVar22 * 2 + 0x2dd) = bVar3;
            uVar18 = uVar18 + 1;
          } while (local_f8 != uVar18);
        }
        uVar22 = (uVar10 - uVar23) + 1;
        *(undefined4 *)((long)workSpace + 0x2a8) = 0;
        if (1 < uVar11) {
          lVar17 = 0;
          iVar29 = 0;
          do {
            lVar19 = lVar17 * 4;
            cVar8 = (char)lVar17;
            *(int *)((long)workSpace + lVar17 * 4 + 4) = iVar29;
            lVar17 = lVar17 + 1;
            iVar29 = (*(int *)((long)workSpace + lVar19 + 0x274) <<
                     ((cVar9 - (char)local_f4[0]) + cVar8 & 0x1fU)) + iVar29;
          } while ((ulong)uVar11 - 1 != lVar17);
        }
        if (uVar23 < uVar22) {
          uVar18 = (ulong)uVar23;
          lVar17 = uVar18 * 0x34;
          do {
            lVar19 = (ulong)uVar11 - 1;
            puVar24 = (uint *)((long)workSpace + 4);
            if (1 < uVar11) {
              do {
                *(uint *)((long)puVar24 + lVar17) = *puVar24 >> ((byte)uVar18 & 0x1f);
                lVar19 = lVar19 + -1;
                puVar24 = puVar24 + 1;
              } while (lVar19 != 0);
            }
            uVar18 = uVar18 + 1;
            lVar17 = lVar17 + 0x34;
          } while (uVar22 != (uint)uVar18);
        }
        local_38 = *(undefined4 *)((long)workSpace + 0x30);
        local_48 = *(undefined8 *)((long)workSpace + 0x20);
        uStack_40 = *(undefined8 *)((long)workSpace + 0x28);
        local_58 = *(undefined8 *)((long)workSpace + 0x10);
        uStack_50 = *(undefined8 *)((long)workSpace + 0x18);
        local_68 = *workSpace;
        uStack_60 = *(undefined8 *)((long)workSpace + 8);
        if (uVar30 != 0) {
          iVar29 = local_f4[0] + 1;
          uVar18 = 0;
          do {
            uVar22 = (uint)*(byte *)((long)workSpace + uVar18 * 2 + 0x2dc);
            bVar3 = *(byte *)((long)workSpace + uVar18 * 2 + 0x2dd);
            uVar28 = iVar29 - (uint)bVar3;
            uVar11 = *(uint *)((long)&local_68 + (ulong)bVar3 * 4);
            uVar20 = (ulong)uVar11;
            bVar14 = (byte)(uVar10 - uVar28);
            iVar12 = 1 << (bVar14 & 0x1f);
            if (uVar10 - uVar28 < uVar23) {
              uVar15 = iVar12 + uVar11;
              if (uVar11 < uVar15) {
                do {
                  DTable[uVar20 + 1] = (uVar28 & 0xff) * 0x10000 + uVar22 + 0x1000000;
                  uVar20 = uVar20 + 1;
                } while (uVar15 != uVar20);
              }
            }
            else {
              uVar15 = (iVar29 - uVar10) + uVar28;
              uVar21 = 1;
              if (1 < (int)uVar15) {
                uVar21 = (ulong)uVar15;
              }
              uVar7 = *(uint *)((long)workSpace + uVar21 * 4 + 0x2a4);
              lVar17 = (ulong)uVar28 * 0x34;
              local_78 = *(undefined4 *)((long)workSpace + lVar17 + 0x30);
              puVar1 = (undefined8 *)((long)workSpace + lVar17 + 0x10);
              puVar2 = (undefined8 *)((long)workSpace + lVar17 + 0x20);
              local_88 = *puVar2;
              uStack_80 = puVar2[1];
              local_98 = *puVar1;
              uStack_90 = puVar1[1];
              local_a8 = *(undefined8 *)((long)workSpace + lVar17);
              uStack_a0 = ((undefined8 *)((long)workSpace + lVar17))[1];
              if ((1 < (int)uVar15) &&
                 (uVar21 = (ulong)*(uint *)((long)&local_a8 + uVar21 * 4), uVar21 != 0)) {
                uVar25 = 0;
                do {
                  DTable[uVar20 + uVar25 + 1] = (uVar28 & 0xff) * 0x10000 + uVar22 + 0x1000000;
                  uVar25 = uVar25 + 1;
                } while (uVar21 != uVar25);
              }
              if (uVar30 != uVar7) {
                uVar21 = 0;
                do {
                  bVar4 = *(byte *)((long)workSpace + uVar21 * 2 + (ulong)uVar7 * 2 + 0x2dc);
                  bVar5 = *(byte *)((long)workSpace + uVar21 * 2 + (ulong)uVar7 * 2 + 0x2dd);
                  uVar15 = *(uint *)((long)&local_a8 + (ulong)bVar5 * 4);
                  uVar16 = (1 << (bVar14 - (char)(iVar29 - (uint)bVar5) & 0x1f)) + uVar15;
                  do {
                    uVar25 = (ulong)uVar15;
                    uVar15 = uVar15 + 1;
                    DTable[uVar20 + uVar25 + 1] =
                         uVar22 + (((iVar29 - (uint)bVar5) + uVar28 & 0xff) << 0x10 |
                                  (uint)bVar4 << 8) + 0x2000000;
                  } while (uVar15 < uVar16);
                  *(uint *)((long)&local_a8 + (ulong)bVar5 * 4) = uVar16;
                  uVar21 = uVar21 + 1;
                } while (uVar21 != uVar30 - uVar7);
              }
            }
            *(uint *)((long)&local_68 + (ulong)bVar3 * 4) = iVar12 + uVar11;
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar30);
        }
        *(char *)DTable = cVar9;
        *(undefined1 *)((long)DTable + 1) = 1;
        *(char *)((long)DTable + 2) = cVar9;
        *(char *)((long)DTable + 3) = (char)(uVar6 >> 0x18);
        sVar27 = sVar13;
      }
    }
  }
  return sVar27;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable,
                       const void* src, size_t srcSize,
                             void* workSpace, size_t wkspSize)
{
    U32 tableLog, maxW, sizeOfSort, nbSymbols;
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    U32 const maxTableLog = dtd.maxTableLog;
    size_t iSize;
    void* dtPtr = DTable+1;   /* force compiler to avoid strict-aliasing */
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;
    U32 *rankStart;

    rankValCol_t* rankVal;
    U32* rankStats;
    U32* rankStart0;
    sortedSymbol_t* sortedSymbol;
    BYTE* weightList;
    size_t spaceUsed32 = 0;

    rankVal = (rankValCol_t *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += (sizeof(rankValCol_t) * HUF_TABLELOG_MAX) >> 2;
    rankStats = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_MAX + 1;
    rankStart0 = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_MAX + 2;
    sortedSymbol = (sortedSymbol_t *)workSpace + (spaceUsed32 * sizeof(U32)) / sizeof(sortedSymbol_t);
    spaceUsed32 += HUF_ALIGN(sizeof(sortedSymbol_t) * (HUF_SYMBOLVALUE_MAX + 1), sizeof(U32)) >> 2;
    weightList = (BYTE *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += HUF_ALIGN(HUF_SYMBOLVALUE_MAX + 1, sizeof(U32)) >> 2;

    if ((spaceUsed32 << 2) > wkspSize) return ERROR(tableLog_tooLarge);

    rankStart = rankStart0 + 1;
    memset(rankStats, 0, sizeof(U32) * (2 * HUF_TABLELOG_MAX + 2 + 1));

    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(HUF_DTable));   /* if compiler fails here, assertion is wrong */
    if (maxTableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    /* memset(weightList, 0, sizeof(weightList)); */  /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats(weightList, HUF_SYMBOLVALUE_MAX + 1, rankStats, &nbSymbols, &tableLog, src, srcSize);
    if (HUF_isError(iSize)) return iSize;

    /* check result */
    if (tableLog > maxTableLog) return ERROR(tableLog_tooLarge);   /* DTable can't fit code depth */

    /* find maxWeight */
    for (maxW = tableLog; rankStats[maxW]==0; maxW--) {}  /* necessarily finds a solution before 0 */

    /* Get start index of each weight */
    {   U32 w, nextRankStart = 0;
        for (w=1; w<maxW+1; w++) {
            U32 current = nextRankStart;
            nextRankStart += rankStats[w];
            rankStart[w] = current;
        }
        rankStart[0] = nextRankStart;   /* put all 0w symbols at the end of sorted list*/
        sizeOfSort = nextRankStart;
    }

    /* sort symbols by weight */
    {   U32 s;
        for (s=0; s<nbSymbols; s++) {
            U32 const w = weightList[s];
            U32 const r = rankStart[w]++;
            sortedSymbol[r].symbol = (BYTE)s;
            sortedSymbol[r].weight = (BYTE)w;
        }
        rankStart[0] = 0;   /* forget 0w symbols; this is beginning of weight(1) */
    }

    /* Build rankVal */
    {   U32* const rankVal0 = rankVal[0];
        {   int const rescale = (maxTableLog-tableLog) - 1;   /* tableLog <= maxTableLog */
            U32 nextRankVal = 0;
            U32 w;
            for (w=1; w<maxW+1; w++) {
                U32 current = nextRankVal;
                nextRankVal += rankStats[w] << (w+rescale);
                rankVal0[w] = current;
        }   }
        {   U32 const minBits = tableLog+1 - maxW;
            U32 consumed;
            for (consumed = minBits; consumed < maxTableLog - minBits + 1; consumed++) {
                U32* const rankValPtr = rankVal[consumed];
                U32 w;
                for (w = 1; w < maxW+1; w++) {
                    rankValPtr[w] = rankVal0[w] >> consumed;
    }   }   }   }

    HUF_fillDTableX2(dt, maxTableLog,
                   sortedSymbol, sizeOfSort,
                   rankStart0, rankVal, maxW,
                   tableLog+1);

    dtd.tableLog = (BYTE)maxTableLog;
    dtd.tableType = 1;
    memcpy(DTable, &dtd, sizeof(dtd));
    return iSize;
}